

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O2

void __thiscall Qclass::Qupdate(Qclass *this,int lastAction,int lastState,int x,int y,int new_state)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  double *pdVar5;
  double dVar6;
  
  this->learn_rate = 0.5;
  this->disc_rew = 0.8;
  iVar3 = rewardfunc(this,lastAction,x,y);
  pdVar5 = this->Q[lastState] + lastAction;
  dVar6 = *pdVar5;
  dVar1 = this->learn_rate;
  if (this->restart == true) {
    dVar6 = (dVar1 * (double)iVar3 + dVar6) - dVar6;
  }
  else {
    dVar2 = this->disc_rew;
    iVar4 = futurereward(this,new_state);
    dVar6 = dVar1 * (((double)iVar4 * dVar2 + (double)iVar3) - dVar6) + dVar6;
  }
  *pdVar5 = dVar6;
  return;
}

Assistant:

void Qclass::Qupdate(int lastAction, int lastState, int x, int y,
                     int new_state) {
  Qclass::learn_rate = 0.5;
  Qclass::disc_rew = 0.8;
  int reward = Qclass::rewardfunc(lastAction, x, y);
  if (restart == true) {
    // Future Reward not taken into account in case of collisions
    Q[lastState][lastAction] = Q[lastState][lastAction] + learn_rate * (reward)
        - Q[lastState][lastAction];
  } else {
    Q[lastState][lastAction] = Q[lastState][lastAction]
        + learn_rate
            * (reward + (disc_rew * futurereward(new_state))
                - Q[lastState][lastAction]);
  }
}